

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::AsioBrokerServer::mainLoop(AsioBrokerServer *this)

{
  element_type *__f;
  long in_RDI;
  UdpServer *this_00;
  TcpServer *in_stack_00000038;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  *in_stack_fffffffffffffee8;
  function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)> *dataFunc;
  TcpServer *in_stack_fffffffffffffef0;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)> *this_01;
  UdpServer *in_stack_ffffffffffffff10;
  function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)> local_b0;
  undefined8 in_stack_ffffffffffffff78;
  io_context *in_stack_ffffffffffffffc0;
  AsioBrokerServer *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::string(in_stack_ffffffffffffff00);
  gmlc::networking::AsioContextManager::getContextPointer((string *)in_stack_ffffffffffffff78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffef0);
  if ((*(byte *)(in_RDI + 0xb0) & 1) != 0) {
    CLI::std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20301e);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x203026);
    loadTCPserver(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffff10 = (UdpServer *)&stack0xffffffffffffffa8;
    CLI::std::shared_ptr<gmlc::networking::TcpServer>::operator=
              ((shared_ptr<gmlc::networking::TcpServer> *)in_stack_fffffffffffffef0,
               (shared_ptr<gmlc::networking::TcpServer> *)in_stack_fffffffffffffee8);
    CLI::std::shared_ptr<gmlc::networking::TcpServer>::~shared_ptr
              ((shared_ptr<gmlc::networking::TcpServer> *)0x203070);
    CLI::std::
    __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x20307a);
    std::
    function<unsigned_long(std::shared_ptr<gmlc::networking::TcpConnection>,char_const*,unsigned_long)>
    ::function<helics::apps::AsioBrokerServer::mainLoop()::__0,void>
              ((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    gmlc::networking::TcpServer::setDataCall(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    CLI::std::
    function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
    ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                 *)0x2030c7);
    loadTCPServerData((portData *)in_stack_ffffffffffffff00);
    CLI::std::
    __shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2030e5);
    gmlc::networking::TcpServer::start(in_stack_00000038);
  }
  if ((*(byte *)(in_RDI + 0xb1) & 1) != 0) {
    CLI::std::
    __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x203175);
    gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x20317d);
    loadUDPserver(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    this_00 = (UdpServer *)(in_RDI + 0x30);
    dataFunc = (function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
                *)&stack0xffffffffffffff70;
    CLI::std::shared_ptr<helics::udp::UdpServer>::operator=
              ((shared_ptr<helics::udp::UdpServer> *)this_00,
               (shared_ptr<helics::udp::UdpServer> *)dataFunc);
    CLI::std::shared_ptr<helics::udp::UdpServer>::~shared_ptr
              ((shared_ptr<helics::udp::UdpServer> *)0x2031c5);
    __f = CLI::std::
          __shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2031cf);
    this_01 = &local_b0;
    std::function<bool(std::shared_ptr<helics::udp::UdpServer>,char_const*,unsigned_long)>::
    function<helics::apps::AsioBrokerServer::mainLoop()::__1,void>
              (this_01,(anon_class_8_1_8991fb9c *)__f);
    udp::UdpServer::setDataCall(this_00,dataFunc);
    CLI::std::function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
    ::~function((function<bool_(std::shared_ptr<helics::udp::UdpServer>,_const_char_*,_unsigned_long)>
                 *)0x203210);
    loadUDPServerData((portData *)this_01);
    CLI::std::__shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20322e);
    udp::UdpServer::start_receive(in_stack_ffffffffffffff10);
  }
  CLI::std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x203267);
  return;
}

Assistant:

void AsioBrokerServer::mainLoop()
    {
#if defined(HELICS_ENABLE_TCP_CORE) || defined(HELICS_ENABLE_UDP_CORE)
        auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
#endif

#ifdef HELICS_ENABLE_TCP_CORE
        if (tcp_enabled_) {
            tcpserver = loadTCPserver(ioctx->getBaseContext());
            tcpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](gmlc::networking::TcpConnection::pointer connection,
                       const char* data,
                       size_t datasize) { return tcpDataReceive(connection, data, datasize); });

            loadTCPServerData(tcpPortData);
            tcpserver->start();
        }
#endif
#ifdef HELICS_ENABLE_UDP_CORE
        if (udp_enabled_) {
            udpserver = loadUDPserver(ioctx->getBaseContext());
            udpserver->setDataCall(
                // NOLINTNEXTLINE
                [this](std::shared_ptr<udp::UdpServer> server, const char* data, size_t datasize) {
                    return udpDataReceive(server, data, datasize);
                });

            loadUDPServerData(udpPortData);
            udpserver->start_receive();
        }
#endif
    }